

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

void reportError(cmGeneratorExpressionContext *context,string *expr,string *result)

{
  ostream *poVar1;
  cmake *this;
  string sStack_1b8;
  ostringstream e;
  
  context->HadError = true;
  if (context->Quiet == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar1 = std::operator<<((ostream *)&e,"Error evaluating generator expression:\n");
    poVar1 = std::operator<<(poVar1,"  ");
    poVar1 = std::operator<<(poVar1,(string *)expr);
    poVar1 = std::operator<<(poVar1,"\n");
    std::operator<<(poVar1,(string *)result);
    this = cmLocalGenerator::GetCMakeInstance(context->LG);
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this,FATAL_ERROR,&sStack_1b8,&context->Backtrace);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

void reportError(cmGeneratorExpressionContext* context,
                 const std::string& expr, const std::string& result)
{
  context->HadError = true;
  if (context->Quiet) {
    return;
  }

  std::ostringstream e;
  /* clang-format off */
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << result;
  /* clang-format on */
  context->LG->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                                context->Backtrace);
}